

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getLoopChangeLocations
          (RelationsAnalyzer *this,VRLocation *join,VectorSet<const_llvm::Value_*> *froms)

{
  initializer_list<const_dg::vr::VRLocation_*> __l;
  bool bVar1;
  const_iterator this_00;
  reference ppVVar2;
  undefined8 in_RCX;
  allocator_type *in_RSI;
  VRLocation *in_RDI;
  V from;
  const_iterator __end3;
  const_iterator __begin3;
  VectorSet<const_llvm::Value_*> *__range3;
  VRLocation *targetLoc;
  Instruction **inloopInst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *__range2;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> changeLocations;
  VRLocation *this_01;
  VRLocation *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  VRLocation *in_stack_ffffffffffffff60;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_90;
  undefined8 local_88;
  VRLocation *local_80;
  reference local_78;
  Instruction **local_70;
  __normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
  local_68;
  vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *local_60;
  VRLocation *local_50;
  VRLocation **local_48;
  undefined8 local_40;
  undefined8 local_20;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_50 = VRLocation::getTreePredecessor(in_stack_ffffffffffffff60);
  local_48 = &local_50;
  local_40 = 1;
  std::allocator<const_dg::vr::VRLocation_*>::allocator
            ((allocator<const_dg::vr::VRLocation_*> *)0x1d0945);
  __l._M_array._4_4_ = in_stack_ffffffffffffff5c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff58;
  __l._M_len = (size_type)in_stack_ffffffffffffff60;
  std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::vector
            ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
             in_stack_ffffffffffffff50,__l,in_RSI);
  std::allocator<const_dg::vr::VRLocation_*>::~allocator
            ((allocator<const_dg::vr::VRLocation_*> *)0x1d0971);
  local_60 = StructureAnalyzer::getInloopValues((StructureAnalyzer *)this_01,in_RDI);
  local_68._M_current =
       (Instruction **)
       std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::begin
                 ((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *)
                  in_RDI);
  local_70 = (Instruction **)
             std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::end
                       ((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                         *)in_RDI);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
                        *)this_01,
                       (__normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
                        *)in_RDI);
    if (!bVar1) {
      std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::vector
                ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
                 this_01,(vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                          *)in_RDI);
LAB_001d0afc:
      std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::~vector
                ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
                 in_stack_ffffffffffffff50);
      return (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
             this_01;
    }
    local_78 = __gnu_cxx::
               __normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
               ::operator*(&local_68);
    VRCodeGraph::getVRLocation((VRCodeGraph *)this_01,(Instruction *)in_RDI);
    local_80 = VRLocation::getSuccLocation(this_01,(uint)((ulong)in_RDI >> 0x20));
    local_88 = local_20;
    local_90._M_current =
         (Value **)VectorSet<const_llvm::Value_*>::begin((VectorSet<const_llvm::Value_*> *)in_RDI);
    this_00 = VectorSet<const_llvm::Value_*>::end((VectorSet<const_llvm::Value_*> *)in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)this_01,
                              (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)in_RDI), bVar1) {
      ppVVar2 = __gnu_cxx::
                __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                ::operator*(&local_90);
      bVar1 = mayOverwrite((RelationsAnalyzer *)this_00._M_current,(I)*ppVVar2,
                           (V)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (bVar1) {
        bVar1 = ValueRelations::hasLoad<llvm::Value_const*>
                          ((ValueRelations *)this_01,(Value **)in_RDI);
        if (!bVar1) {
          memset(in_RDI,0,0x18);
          std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::
          vector((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
                 0x1d0a9b);
          goto LAB_001d0afc;
        }
        in_stack_ffffffffffffff50 = local_80;
        std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
        emplace_back<dg::vr::VRLocation*>
                  ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                    *)local_80,(VRLocation **)in_RSI);
      }
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++(&local_90);
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
    ::operator++(&local_68);
  } while( true );
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getLoopChangeLocations(const VRLocation &join,
                                          const VectorSet<V> &froms) const {
    std::vector<const VRLocation *> changeLocations = {
            &join.getTreePredecessor()};

    for (const auto &inloopInst : structure.getInloopValues(join)) {
        VRLocation &targetLoc =
                *codeGraph.getVRLocation(inloopInst).getSuccLocation(0);

        for (V from : froms) {
            if (mayOverwrite(inloopInst, from)) {
                if (!targetLoc.relations.hasLoad(from))
                    return {}; // no merge by load can happen here

                changeLocations.emplace_back(&targetLoc);
            }
        }
    }
    return changeLocations;
}